

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Block * __thiscall wasm::Builder::makeBlock(Builder *this,Expression *first)

{
  Block *pBVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pBVar1 = (Block *)MixedArena::allocSpace(this_00,0x40,8);
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (pBVar1->name).super_IString.str._M_len = 0;
  (pBVar1->name).super_IString.str._M_str = (char *)0x0;
  (pBVar1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (pBVar1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pBVar1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pBVar1->list).allocator = this_00;
  if (first != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar1->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,first);
    wasm::Block::finalize(pBVar1);
  }
  return pBVar1;
}

Assistant:

Block* makeBlock(Expression* first = nullptr) {
    auto* ret = wasm.allocator.alloc<Block>();
    if (first) {
      ret->list.push_back(first);
      ret->finalize();
    }
    return ret;
  }